

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

RefCntAutoPtr<Diligent::FramebufferVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
          (RefCntAutoPtr<Diligent::FramebufferVkImpl> *this,FramebufferVkImpl *pObj)

{
  FramebufferVkImpl *this_00;
  char (*in_RCX) [26];
  RefCountersImpl *this_01;
  string msg;
  string local_30;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (FramebufferVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ::Release((DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (FramebufferVkImpl *)0x0) {
      this_01 = (pObj->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                .super_ObjectBase<Diligent::IFramebufferVk>.
                super_RefCountedObject<Diligent::IFramebufferVk>.m_pRefCounters;
      if (this_01 == (RefCountersImpl *)0x0) {
        FormatString<char[26],char[26]>
                  (&local_30,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"AddRef",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                   ,0x221);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        this_01 = (pObj->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                  .super_ObjectBase<Diligent::IFramebufferVk>.
                  super_RefCountedObject<Diligent::IFramebufferVk>.m_pRefCounters;
      }
      RefCountersImpl::AddStrongRef(this_01);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }